

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsPort.cpp
# Opt level: O3

void __thiscall
AmsPort::AddNotification(AmsPort *this,AmsAddr ams,uint32_t hNotify,SharedDispatcher *dispatcher)

{
  int iVar1;
  pair<const_AmsAddr,_const_unsigned_int> local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar1 == 0) {
    local_38.first = ams;
    local_38.second = hNotify;
    std::
    _Rb_tree<std::pair<AmsAddr_const,unsigned_int_const>,std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>,std::_Select1st<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>,std::less<std::pair<AmsAddr_const,unsigned_int_const>>,std::allocator<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>>
    ::
    _M_emplace_unique<std::pair<AmsAddr_const,unsigned_int_const>,std::shared_ptr<NotificationDispatcher>&>
              ((_Rb_tree<std::pair<AmsAddr_const,unsigned_int_const>,std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>,std::_Select1st<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>,std::less<std::pair<AmsAddr_const,unsigned_int_const>>,std::allocator<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>>
                *)&this->dispatcherList,&local_38,dispatcher);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void AmsPort::AddNotification(const AmsAddr ams, const uint32_t hNotify, SharedDispatcher dispatcher)
{
    std::lock_guard<std::mutex> lock(mutex);
    dispatcherList.emplace(NotifyUUID {ams, hNotify}, dispatcher);
}